

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlCheckErrors(void)

{
  bool bVar1;
  GLenum GVar2;
  GLenum err;
  int check;
  
  bVar1 = true;
  while (bVar1) {
    GVar2 = (*glad_glGetError)();
    if (GVar2 == 0) {
      bVar1 = false;
    }
    else if (GVar2 == 0x500) {
      TraceLog(4,"GL: Error detected: GL_INVALID_ENUM");
    }
    else if (GVar2 == 0x501) {
      TraceLog(4,"GL: Error detected: GL_INVALID_VALUE");
    }
    else if (GVar2 == 0x502) {
      TraceLog(4,"GL: Error detected: GL_INVALID_OPERATION");
    }
    else if (GVar2 == 0x503) {
      TraceLog(4,"GL: Error detected: GL_STACK_OVERFLOW");
    }
    else if (GVar2 == 0x504) {
      TraceLog(4,"GL: Error detected: GL_STACK_UNDERFLOW");
    }
    else if (GVar2 == 0x505) {
      TraceLog(4,"GL: Error detected: GL_OUT_OF_MEMORY");
    }
    else if (GVar2 == 0x506) {
      TraceLog(4,"GL: Error detected: GL_INVALID_FRAMEBUFFER_OPERATION");
    }
    else {
      TraceLog(4,"GL: Error detected: Unknown error code: %x",(ulong)GVar2);
    }
  }
  return;
}

Assistant:

void rlCheckErrors()
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    int check = 1;
    while (check)
    {
        const GLenum err = glGetError();
        switch (err)
        {
            case GL_NO_ERROR: check = 0; break;
            case 0x0500: TRACELOG(LOG_WARNING, "GL: Error detected: GL_INVALID_ENUM"); break;
            case 0x0501: TRACELOG(LOG_WARNING, "GL: Error detected: GL_INVALID_VALUE"); break;
            case 0x0502: TRACELOG(LOG_WARNING, "GL: Error detected: GL_INVALID_OPERATION"); break;
            case 0x0503: TRACELOG(LOG_WARNING, "GL: Error detected: GL_STACK_OVERFLOW"); break;
            case 0x0504: TRACELOG(LOG_WARNING, "GL: Error detected: GL_STACK_UNDERFLOW"); break;
            case 0x0505: TRACELOG(LOG_WARNING, "GL: Error detected: GL_OUT_OF_MEMORY"); break;
            case 0x0506: TRACELOG(LOG_WARNING, "GL: Error detected: GL_INVALID_FRAMEBUFFER_OPERATION"); break;
            default: TRACELOG(LOG_WARNING, "GL: Error detected: Unknown error code: %x", err); break;
        }
    }
#endif
}